

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaLinCon.cpp
# Opt level: O0

char * LinControlKindToStrIO(NaLinearControlKind eK)

{
  NaLinearControlKind eK_local;
  char *local_8;
  
  switch(eK) {
  case lckGain:
    local_8 = "gain";
    break;
  case lckInertial:
    local_8 = "inertial";
    break;
  case lckIntegral:
    local_8 = "integral";
    break;
  case lckDifferential:
    local_8 = "differential";
    break;
  case lckDiffStatic:
    local_8 = "diffstatic";
    break;
  case lckOscillation:
    local_8 = "oscillation";
    break;
  case lckConservative:
    local_8 = "conservative";
    break;
  case lckDelay:
    local_8 = "delay";
    break;
  default:
    local_8 = "???";
  }
  return local_8;
}

Assistant:

const char*
LinControlKindToStrIO (NaLinearControlKind eK)
{
    switch(eK){
    case lckGain:
        return "gain";
    case lckInertial:
        return "inertial";
    case lckIntegral:
        return "integral";
    case lckDifferential:
        return "differential";
    case lckDiffStatic:
        return "diffstatic";
    case lckOscillation:
        return "oscillation";
    case lckConservative:
        return "conservative";
    case lckDelay:
        return "delay";
    }
    return "???";
}